

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O2

void __thiscall QToolBar::clear(QToolBar *this)

{
  int i;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QAction_*> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
  QWidget::actions((QList<QAction_*> *)&local_38,&this->super_QWidget);
  for (puVar1 = (undefined1 *)0x0; puVar1 < (ulong)local_38.size; puVar1 = puVar1 + 1) {
    QWidget::removeAction(&this->super_QWidget,local_38.ptr[(long)puVar1]);
  }
  QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBar::clear()
{
    QList<QAction *> actions = this->actions();
    for(int i = 0; i < actions.size(); i++)
        removeAction(actions.at(i));
}